

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_HandleXrun(PaAlsaStream *self)

{
  PaUnixMutex *self_00;
  snd_pcm_t *psVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  int iVar4;
  undefined1 *puVar5;
  char *format;
  undefined1 *__s;
  bool bVar6;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  long local_40;
  snd_timestamp_t t;
  
  uStack_50 = 0x113064;
  t.tv_usec = (__suseconds_t)PaUtil_GetTime();
  uStack_50 = 0x11306e;
  __n = snd_pcm_status_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_48 + lVar2;
  iVar4 = 0;
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x11308c;
  memset(__s,0,__n);
  bVar6 = true;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1130a3;
    puVar5 = __s;
    snd_pcm_status();
    iVar4 = (int)puVar5;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1130ab;
    iVar3 = snd_pcm_status_get_state(__s);
    if (iVar3 == 4) {
      iVar4 = (int)&local_40;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1130bf;
      snd_pcm_status_get_trigger_tstamp(__s);
      self->underrun =
           (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
      if ((self->playback).canMmap == 0) {
        psVar1 = (self->playback).pcm;
        iVar4 = -0x20;
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113113;
        iVar3 = snd_pcm_recover(psVar1,0xffffffe0,0);
        bVar6 = -1 < iVar3;
      }
      else {
        bVar6 = false;
      }
    }
  }
  if ((self->capture).pcm == (snd_pcm_t *)0x0) {
LAB_001131b2:
    if (bVar6) {
      return 0;
    }
  }
  else {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113131;
    puVar5 = __s;
    snd_pcm_status();
    iVar4 = (int)puVar5;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113139;
    iVar3 = snd_pcm_status_get_state(__s);
    if (iVar3 != 4) goto LAB_001131b2;
    iVar4 = (int)&local_40;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x11314d;
    snd_pcm_status_get_trigger_tstamp(__s);
    self->overrun =
         (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
    if ((self->capture).canMmap == 0) {
      psVar1 = (self->capture).pcm;
      iVar4 = -0x20;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1131a6;
      iVar3 = snd_pcm_recover(psVar1,0xffffffe0,0);
      if ((bool)(-1 < iVar3 & bVar6)) {
        return 0;
      }
    }
  }
  self_00 = &self->stateMtx;
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1131c6;
  paUtilErr_ = PaUnixMutex_Lock(self_00);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaUnixMutex_Lock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3239\n"
    ;
  }
  else {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1131dc;
    paUtilErr_ = AlsaStop(self,iVar4);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'AlsaStop( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3240\n"
      ;
    }
    else {
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1131f2;
      paUtilErr_ = AlsaStart(self,iVar4);
      iVar4 = 0;
      if (-1 < paUtilErr_) goto LAB_00113203;
      format = 
      "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3241\n"
      ;
    }
  }
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113297;
  PaUtil_DebugPrint(format);
  iVar4 = paUtilErr_;
LAB_00113203:
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x11320b;
  paUtilErr_ = PaUnixMutex_Unlock(self_00);
  while (paUtilErr_ < 0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113245;
    PaUtil_DebugPrint(
                     "Expression \'PaUnixMutex_Unlock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3246\n"
                     );
    iVar4 = paUtilErr_;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113254;
    paUtilErr_ = PaUnixMutex_Unlock(self_00);
  }
  if (-1 < iVar4) {
    paUtilErr_ = iVar4;
    return 0;
  }
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113277;
  paUtilErr_ = iVar4;
  PaUtil_DebugPrint(
                   "Expression \'AlsaRestart( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3308\n"
                   );
  return paUtilErr_;
}

Assistant:

static PaError PaAlsaStream_HandleXrun( PaAlsaStream *self )
{
    PaError result = paNoError;
    snd_pcm_status_t *st;
    PaTime now = PaUtil_GetTime();
    snd_timestamp_t t;
    int restartAlsa = 0; /* do not restart Alsa by default */

    alsa_snd_pcm_status_alloca( &st );

    if( self->playback.pcm )
    {
        alsa_snd_pcm_status( self->playback.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->underrun = now * 1000 - ( (PaTime)t.tv_sec * 1000 + (PaTime)t.tv_usec / 1000 );

            if( !self->playback.canMmap )
            {
                if( alsa_snd_pcm_recover( self->playback.pcm, -EPIPE, 0 ) < 0 )
                {
                    PA_DEBUG(( "%s: [playback] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }
    if( self->capture.pcm )
    {
        alsa_snd_pcm_status( self->capture.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->overrun = now * 1000 - ((PaTime) t.tv_sec * 1000 + (PaTime) t.tv_usec / 1000);

            if (!self->capture.canMmap)
            {
                if (alsa_snd_pcm_recover( self->capture.pcm, -EPIPE, 0 ) < 0)
                {
                    PA_DEBUG(( "%s: [capture] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }

    if( restartAlsa )
    {
        PA_DEBUG(( "%s: restarting Alsa to recover from XRUN\n", __FUNCTION__ ));
        PA_ENSURE( AlsaRestart( self ) );
    }

end:
    return result;
error:
    goto end;
}